

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.cpp
# Opt level: O0

void __thiscall
jessilib::callback_with_iterations::callback_with_iterations
          (callback_with_iterations *this,callback_with_iterations *in_callback)

{
  callback_with_iterations *in_callback_local;
  callback_with_iterations *this_local;
  memory_order __b;
  
  std::function<void_(jessilib::timer_&)>::function(&this->m_callback,&in_callback->m_callback);
  std::operator&(seq_cst,__memory_order_mask);
  std::atomic<unsigned_long>::atomic
            (&this->m_iterations,(in_callback->m_iterations).super___atomic_base<unsigned_long>._M_i
            );
  cancel_token::cancel_token(&this->m_cancel_token);
  return;
}

Assistant:

callback_with_iterations(callback_with_iterations&& in_callback)
		: m_callback{ std::move(in_callback.m_callback) },
		m_iterations{ in_callback.m_iterations.load() } {
		// Empty ctor body
	}